

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  int iVar1;
  TPZFrontSym<std::complex<double>_> *this_00;
  TPZFMatrix<std::complex<double>_> *this_01;
  complex<double> *this_02;
  TPZVec<long> *in_RDX;
  int64_t in_RDI;
  int64_t nel;
  int64_t jlocal;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  complex<double> *in_stack_ffffffffffffffa8;
  TPZFrontSym<std::complex<double>_> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  
  this_00 = (TPZFrontSym<std::complex<double>_> *)TPZVec<long>::NElements(in_RDX);
  for (local_20 = 0; local_20 < (long)this_00; local_20 = local_20 + 1) {
    TPZVec<long>::operator[](in_RDX,local_20);
    iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
    this_01 = (TPZFMatrix<std::complex<double>_> *)(long)iVar1;
    for (local_28 = local_20; local_28 < (long)this_00; local_28 = local_28 + 1) {
      TPZVec<long>::operator[](in_RDX,local_28);
      iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
      in_stack_ffffffffffffffc8 = (TPZFrontSym<std::complex<double>_> *)(long)iVar1;
      this_02 = TPZFMatrix<std::complex<double>_>::operator()
                          (this_01,(int64_t)in_stack_ffffffffffffffc8,(int64_t)this_00);
      Element(this_00,in_RDI,(int64_t)this_02);
      std::complex<double>::operator+=(this_02,in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}